

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O0

void __thiscall RSTARPlanner::InitializeSearchStateInfo(RSTARPlanner *this,RSTARState *state)

{
  int iVar1;
  CMDPSTATE *in_RSI;
  RSTARPlanner *in_RDI;
  
  *(undefined4 *)
   &(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = 1000000000;
  *(undefined2 *)
   ((long)&(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = 0;
  *(unsigned_short *)
   ((long)&(in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + 6) = in_RDI->pSearchStateSpace->callnumber;
  *(undefined4 *)
   &(in_RSI->Actions).super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
    super__Vector_impl_data._M_finish = 0;
  (in_RSI->PredsID).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (in_RDI->pSearchStateSpace->searchgoalstate == (CMDPSTATE *)0x0) {
    *(undefined4 *)
     &in_RSI[1].Actions.super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>._M_impl.
      super__Vector_impl_data._M_start = 0;
  }
  else {
    iVar1 = ComputeHeuristic(in_RDI,in_RSI);
    *(int *)&in_RSI[1].Actions.super__Vector_base<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>.
             _M_impl.super__Vector_impl_data._M_start = iVar1;
  }
  std::vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_>::clear
            ((vector<CMDPACTION_*,_std::allocator<CMDPACTION_*>_> *)0x1a633b);
  return;
}

Assistant:

void RSTARPlanner::InitializeSearchStateInfo(RSTARState* state)
{
    state->g = INFINITECOST;
    state->iterationclosed = 0;
    state->callnumberaccessed = pSearchStateSpace->callnumber;
    state->heapindex = 0;
    state->bestpredaction = NULL;

    //compute heuristics
#if USE_HEUR
    if(pSearchStateSpace->searchgoalstate != NULL)
    state->h = ComputeHeuristic(state->MDPstate);
    else
    state->h = 0;
#else
    state->h = 0;
#endif

    state->predactionV.clear();
}